

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O2

bool __thiscall
DIS::ElectromagneticEmissionSystemData::operator==
          (ElectromagneticEmissionSystemData *this,ElectromagneticEmissionSystemData *rhs)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  pointer pEVar5;
  bool bVar6;
  bool bVar7;
  size_t idx;
  ulong uVar8;
  long lVar9;
  
  uVar1 = rhs->_systemDataLength;
  uVar2 = this->_systemDataLength;
  uVar3 = rhs->_emissionsPadding2;
  uVar4 = this->_emissionsPadding2;
  bVar6 = EmitterSystem::operator==(&this->_emitterSystem,&rhs->_emitterSystem);
  bVar7 = Vector3Float::operator==(&this->_location,&rhs->_location);
  bVar6 = ((bVar7 && bVar6) && uVar4 == uVar3) && uVar2 == uVar1;
  lVar9 = 0;
  for (uVar8 = 0;
      pEVar5 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)(((long)(this->_beamDataRecords).
                             super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5) / 0x60);
      uVar8 = uVar8 + 1) {
    bVar7 = ElectromagneticEmissionBeamData::operator==
                      ((ElectromagneticEmissionBeamData *)
                       ((long)&pEVar5->_vptr_ElectromagneticEmissionBeamData + lVar9),
                       (ElectromagneticEmissionBeamData *)
                       ((long)&((rhs->_beamDataRecords).
                                super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_ElectromagneticEmissionBeamData + lVar9));
    bVar6 = (bool)(bVar6 & bVar7);
    lVar9 = lVar9 + 0x60;
  }
  return bVar6;
}

Assistant:

bool ElectromagneticEmissionSystemData::operator ==(const ElectromagneticEmissionSystemData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemDataLength == rhs._systemDataLength) ) ivarsEqual = false;
     if( ! (_emissionsPadding2 == rhs._emissionsPadding2) ) ivarsEqual = false;
     if( ! (_emitterSystem == rhs._emitterSystem) ) ivarsEqual = false;
     if( ! (_location == rhs._location) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _beamDataRecords.size(); idx++)
     {
        if( ! ( _beamDataRecords[idx] == rhs._beamDataRecords[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }